

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlStreamCtxtPtr xmlNewStreamCtxt(xmlStreamCompPtr stream)

{
  xmlDict *pxVar1;
  xmlStreamCtxtPtr cur;
  xmlStreamCompPtr stream_local;
  
  stream_local = (xmlStreamCompPtr)(*xmlMalloc)(0x30);
  if (stream_local == (xmlStreamCompPtr)0x0) {
    stream_local = (xmlStreamCompPtr)0x0;
  }
  else {
    memset(stream_local,0,0x30);
    pxVar1 = (xmlDict *)(*xmlMalloc)(0x20);
    stream_local[1].dict = pxVar1;
    if (stream_local[1].dict == (xmlDict *)0x0) {
      (*xmlFree)(stream_local);
      stream_local = (xmlStreamCompPtr)0x0;
    }
    else {
      *(undefined4 *)&stream_local->steps = 0;
      *(undefined4 *)((long)&stream_local->steps + 4) = 4;
      stream_local->flags = 0;
      *(xmlStreamCompPtr *)&stream_local->nbStep = stream;
      stream_local[1].maxStep = -1;
    }
  }
  return (xmlStreamCtxtPtr)stream_local;
}

Assistant:

static xmlStreamCtxtPtr
xmlNewStreamCtxt(xmlStreamCompPtr stream) {
    xmlStreamCtxtPtr cur;

    cur = (xmlStreamCtxtPtr) xmlMalloc(sizeof(xmlStreamCtxt));
    if (cur == NULL) {
	ERROR(NULL, NULL, NULL,
		"xmlNewStreamCtxt: malloc failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlStreamCtxt));
    cur->states = (int *) xmlMalloc(4 * 2 * sizeof(int));
    if (cur->states == NULL) {
	xmlFree(cur);
	ERROR(NULL, NULL, NULL,
	      "xmlNewStreamCtxt: malloc failed\n");
	return(NULL);
    }
    cur->nbState = 0;
    cur->maxState = 4;
    cur->level = 0;
    cur->comp = stream;
    cur->blockLevel = -1;
    return(cur);
}